

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O2

bc_slist_t * blogc_source_parse_from_files(bc_trie_t *conf,bc_slist_t *l,bc_error_t **err)

{
  ulong uVar1;
  _Bool _Var2;
  _Bool _Var3;
  int iVar4;
  char *pcVar5;
  bc_trie_t *pbVar6;
  char *pcVar7;
  bc_slist_t *l_00;
  size_t sVar8;
  bc_error_t *pbVar9;
  char *pcVar10;
  char *pcVar11;
  char **strv;
  bc_slist_t *pbVar12;
  bc_slist_t *tmp;
  _bc_slist_t *p_Var13;
  bc_slist_t *tmp_2;
  code *cmp;
  ulong uVar14;
  char **ppcVar15;
  bool bVar16;
  float fVar17;
  bc_error_t *tmp_err;
  bc_slist_t *local_80;
  ulong local_78;
  bc_slist_t *local_70;
  char *endptr;
  char *local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if ((err == (bc_error_t **)0x0) || (*err != (bc_error_t *)0x0)) {
    pbVar12 = (bc_slist_t *)0x0;
  }
  else {
    pcVar5 = (char *)bc_trie_lookup(conf,"FILTER_SORT");
    _Var2 = bc_str_to_bool(pcVar5);
    tmp_err = (bc_error_t *)0x0;
    uVar14 = 0;
    l_00 = (bc_slist_t *)0x0;
    local_70 = l;
    for (; l != (bc_slist_t *)0x0; l = l->next) {
      pcVar5 = (char *)l->data;
      pbVar6 = blogc_source_parse_from_file(conf,pcVar5,&tmp_err);
      if (pbVar6 == (bc_trie_t *)0x0) {
        pbVar9 = bc_error_new_printf(BLOGC_ERROR_LOADER,
                                     "An error occurred while parsing source file: %s\n\n%s",pcVar5,
                                     tmp_err->msg);
        *err = pbVar9;
        bc_error_free(tmp_err);
        goto LAB_00103253;
      }
      pcVar7 = (char *)bc_trie_lookup(pbVar6,"DATE");
      uVar14 = (uVar14 + 1) - (ulong)(pcVar7 == (char *)0x0);
      if (_Var2) {
        if (pcVar7 == (char *)0x0) {
          pbVar9 = bc_error_new_printf(BLOGC_ERROR_LOADER,
                                       "\'FILTER_SORT\' requires that \'DATE\' variable is set for every source file: %s"
                                       ,pcVar5);
          *err = pbVar9;
        }
        else {
          pcVar7 = blogc_convert_datetime(pcVar7,"%s",&tmp_err);
          if (pcVar7 != (char *)0x0) {
            bc_trie_insert(pbVar6,"c",pcVar7);
            goto LAB_00103131;
          }
          pbVar9 = bc_error_new_printf(BLOGC_ERROR_LOADER,
                                       "An error occurred while parsing \'DATE\' variable: %s\n\n%s"
                                       ,pcVar5,tmp_err->msg);
          *err = pbVar9;
          bc_error_free(tmp_err);
        }
        bc_trie_free(pbVar6);
        goto LAB_00103253;
      }
LAB_00103131:
      l_00 = bc_slist_append(l_00,pbVar6);
    }
    if ((uVar14 == 0) || (sVar8 = bc_slist_length(local_70), sVar8 <= uVar14)) {
      pcVar5 = (char *)bc_trie_lookup(conf,"FILTER_REVERSE");
      _Var3 = bc_str_to_bool(pcVar5);
      if (_Var2) {
        cmp = sort_source;
        if (_Var3) {
          cmp = sort_source_reverse;
        }
        local_80 = bc_slist_sort(l_00,cmp);
      }
      else {
        local_80 = l_00;
        if (_Var3) {
          pbVar12 = (bc_slist_t *)0x0;
          for (p_Var13 = l_00; p_Var13 != (bc_slist_t *)0x0; p_Var13 = p_Var13->next) {
            pbVar12 = bc_slist_prepend(pbVar12,p_Var13->data);
          }
          local_80 = pbVar12;
          bc_slist_free(l_00);
        }
      }
      pcVar7 = (char *)bc_trie_lookup(conf,"FILTER_TAG");
      pcVar10 = (char *)bc_trie_lookup(conf,"FILTER_PAGE");
      pcVar11 = (char *)bc_trie_lookup(conf,"FILTER_PER_PAGE");
      pcVar5 = "";
      if (pcVar10 != (char *)0x0) {
        pcVar5 = pcVar10;
      }
      local_60 = pcVar10;
      local_48 = strtol(pcVar5,&endptr,10);
      if ((*pcVar5 != '\0') && (*endptr != '\0')) {
        fprintf(_stderr,
                "warning: invalid value for \'FILTER_PAGE\' variable: %s. using %ld instead\n",
                pcVar5,local_48);
      }
      local_78 = 1;
      if (1 < (long)local_48) {
        local_78 = local_48;
      }
      pcVar5 = "10";
      if (pcVar11 != (char *)0x0) {
        pcVar5 = pcVar11;
      }
      local_50 = strtol(pcVar5,&endptr,10);
      if ((*pcVar5 != '\0') && (*endptr != '\0')) {
        fprintf(_stderr,
                "warning: invalid value for \'FILTER_PER_PAGE\' variable: %s. using %ld instead\n",
                pcVar5,local_50);
      }
      uVar14 = 0;
      if ((long)local_50 < 1) {
        local_50 = uVar14;
      }
      local_58 = local_78 - 1;
      local_38 = local_50 * local_58;
      local_40 = local_50 * local_78;
      pbVar12 = (bc_slist_t *)0x0;
      for (p_Var13 = local_80; p_Var13 != (bc_slist_t *)0x0; p_Var13 = p_Var13->next) {
        pbVar6 = (bc_trie_t *)p_Var13->data;
        if (pcVar7 == (char *)0x0) {
LAB_00103411:
          if ((local_60 == (char *)0x0) ||
             ((uVar1 = uVar14 + 1, local_38 <= uVar14 &&
              (bVar16 = uVar14 < local_40, uVar14 = uVar1, bVar16)))) {
            pbVar12 = bc_slist_append(pbVar12,pbVar6);
          }
          else {
            bc_trie_free(pbVar6);
            uVar14 = uVar1;
          }
        }
        else {
          pcVar5 = (char *)bc_trie_lookup(pbVar6,"TAGS");
          if (pcVar5 != (char *)0x0) {
            bVar16 = false;
            local_70 = pbVar12;
            strv = bc_str_split(pcVar5,' ',0);
            for (ppcVar15 = strv; pcVar5 = *ppcVar15, pcVar5 != (char *)0x0; ppcVar15 = ppcVar15 + 1
                ) {
              if (*pcVar5 != '\0') {
                iVar4 = strcmp(pcVar5,pcVar7);
                bVar16 = (bool)(bVar16 | iVar4 == 0);
              }
            }
            bc_strv_free(strv);
            pbVar12 = local_70;
            if (bVar16) goto LAB_00103411;
          }
          bc_trie_free(pbVar6);
        }
      }
      bc_slist_free(local_80);
      bVar16 = true;
      for (p_Var13 = pbVar12; uVar1 = local_78, p_Var13 != (bc_slist_t *)0x0;
          p_Var13 = p_Var13->next) {
        pbVar6 = (bc_trie_t *)p_Var13->data;
        if (bVar16) {
          pcVar5 = (char *)bc_trie_lookup(pbVar6,"DATE");
          if (pcVar5 != (char *)0x0) {
            pcVar5 = bc_strdup(pcVar5);
            bc_trie_insert(conf,"DATE_FIRST",pcVar5);
          }
          pcVar5 = (char *)bc_trie_lookup(pbVar6,"FILENAME");
          if (pcVar5 != (char *)0x0) {
            pcVar5 = bc_strdup(pcVar5);
            bc_trie_insert(conf,"FILENAME_FIRST",pcVar5);
          }
        }
        if (p_Var13->next == (_bc_slist_t *)0x0) {
          pcVar5 = (char *)bc_trie_lookup(pbVar6,"DATE");
          if (pcVar5 != (char *)0x0) {
            pcVar5 = bc_strdup(pcVar5);
            bc_trie_insert(conf,"DATE_LAST",pcVar5);
          }
          pcVar5 = (char *)bc_trie_lookup(pbVar6,"FILENAME");
          if (pcVar5 != (char *)0x0) {
            pcVar5 = bc_strdup(pcVar5);
            bc_trie_insert(conf,"FILENAME_LAST",pcVar5);
          }
        }
        bVar16 = false;
      }
      if (local_60 != (char *)0x0) {
        fVar17 = ceilf((float)uVar14 / (float)(long)local_50);
        uVar14 = (long)(fVar17 - 9.223372e+18) & (long)fVar17 >> 0x3f | (long)fVar17;
        pcVar5 = bc_strdup_printf("%ld",uVar1);
        bc_trie_insert(conf,"CURRENT_PAGE",pcVar5);
        if (1 < (long)local_48) {
          pcVar5 = bc_strdup_printf("%ld",local_58);
          bc_trie_insert(conf,"PREVIOUS_PAGE",pcVar5);
        }
        if (uVar1 < uVar14) {
          pcVar5 = bc_strdup_printf("%ld",uVar1 + 1);
          bc_trie_insert(conf,"NEXT_PAGE",pcVar5);
        }
        sVar8 = bc_slist_length(pbVar12);
        if (sVar8 != 0) {
          pcVar5 = bc_strdup("1");
          bc_trie_insert(conf,"FIRST_PAGE",pcVar5);
        }
        if (uVar14 != 0) {
          pcVar5 = bc_strdup_printf("%d",uVar14);
          bc_trie_insert(conf,"LAST_PAGE",pcVar5);
        }
      }
    }
    else {
      pbVar9 = bc_error_new_printf(BLOGC_ERROR_LOADER,
                                   "\'DATE\' variable provided for at least one source file, but not for all source files. It must be provided for all files."
                                  );
      *err = pbVar9;
LAB_00103253:
      pbVar12 = (bc_slist_t *)0x0;
      bc_slist_free_full(l_00,bc_trie_free);
    }
  }
  return pbVar12;
}

Assistant:

bc_slist_t*
blogc_source_parse_from_files(bc_trie_t *conf, bc_slist_t *l, bc_error_t **err)
{
    if (err == NULL || *err != NULL)
        return NULL;

    bool sort = bc_str_to_bool(bc_trie_lookup(conf, "FILTER_SORT"));

    bc_slist_t* sources = NULL;
    bc_error_t *tmp_err = NULL;
    size_t with_date = 0;
    for (bc_slist_t *tmp = l; tmp != NULL; tmp = tmp->next) {
        char *f = tmp->data;
        bc_trie_t *s = blogc_source_parse_from_file(conf, f, &tmp_err);
        if (s == NULL) {
            *err = bc_error_new_printf(BLOGC_ERROR_LOADER,
                "An error occurred while parsing source file: %s\n\n%s",
                f, tmp_err->msg);
            bc_error_free(tmp_err);
            bc_slist_free_full(sources, (bc_free_func_t) bc_trie_free);
            return NULL;
        }

        const char *date = bc_trie_lookup(s, "DATE");
        if (date != NULL) {
            with_date++;
        }

        if (sort) {
            if (date == NULL) {
                *err = bc_error_new_printf(BLOGC_ERROR_LOADER,
                    "'FILTER_SORT' requires that 'DATE' variable is set for "
                    "every source file: %s", f);
                bc_trie_free(s);
                bc_slist_free_full(sources, (bc_free_func_t) bc_trie_free);
                return NULL;
            }

            char *timestamp = blogc_convert_datetime(date, "%s", &tmp_err);
            if (timestamp == NULL) {
                *err = bc_error_new_printf(BLOGC_ERROR_LOADER,
                    "An error occurred while parsing 'DATE' variable: %s"
                    "\n\n%s", f, tmp_err->msg);
                bc_error_free(tmp_err);
                bc_trie_free(s);
                bc_slist_free_full(sources, (bc_free_func_t) bc_trie_free);
                return NULL;
            }

            bc_trie_insert(s, "c", timestamp);
        }

        sources = bc_slist_append(sources, s);
    }

    if (with_date > 0 && with_date < bc_slist_length(l)) {
        *err = bc_error_new_printf(BLOGC_ERROR_LOADER,
            "'DATE' variable provided for at least one source file, but not "
            "for all source files. It must be provided for all files.");
        bc_slist_free_full(sources, (bc_free_func_t) bc_trie_free);
        return NULL;
    }

    bool reverse = bc_str_to_bool(bc_trie_lookup(conf, "FILTER_REVERSE"));

    if (sort) {
        sources = bc_slist_sort(sources,
            (bc_sort_func_t) (reverse ? sort_source_reverse : sort_source));
    }
    else if (reverse) {
        bc_slist_t *tmp_sources = NULL;
        for (bc_slist_t *tmp = sources; tmp != NULL; tmp = tmp->next) {
            tmp_sources = bc_slist_prepend(tmp_sources, tmp->data);
        }
        bc_slist_t *tmp = sources;
        sources = tmp_sources;
        bc_slist_free(tmp);
    }

    const char *filter_tag = bc_trie_lookup(conf, "FILTER_TAG");
    const char *filter_page = bc_trie_lookup(conf, "FILTER_PAGE");
    const char *filter_per_page = bc_trie_lookup(conf, "FILTER_PER_PAGE");

    const char *ptr;
    char *endptr;

    ptr = filter_page != NULL ? filter_page : "";
    long page = strtol(ptr, &endptr, 10);
    if (*ptr != '\0' && *endptr != '\0')
        fprintf(stderr, "warning: invalid value for 'FILTER_PAGE' variable: "
            "%s. using %ld instead\n", ptr, page);
    if (page <= 0)
        page = 1;

    ptr = filter_per_page != NULL ? filter_per_page : "10";
    long per_page = strtol(ptr, &endptr, 10);
    if (*ptr != '\0' && *endptr != '\0')
        fprintf(stderr, "warning: invalid value for 'FILTER_PER_PAGE' variable: "
            "%s. using %ld instead\n", ptr, per_page);
    if (per_page < 0)
        per_page = 0;

    // poor man's pagination
    size_t start = (page - 1) * per_page;
    size_t end = start + per_page;
    size_t counter = 0;

    bc_slist_t *rv = NULL;
    for (bc_slist_t *tmp = sources; tmp != NULL; tmp = tmp->next) {
        bc_trie_t *s = tmp->data;
        if (filter_tag != NULL) {
            const char *tags_str = bc_trie_lookup(s, "TAGS");
            // if user wants to filter by tag and no tag is provided, skip it
            if (tags_str == NULL) {
                bc_trie_free(s);
                continue;
            }
            char **tags = bc_str_split(tags_str, ' ', 0);
            bool found = false;
            for (size_t i = 0; tags[i] != NULL; i++) {
                if (tags[i][0] == '\0')
                    continue;
                if (0 == strcmp(tags[i], filter_tag))
                    found = true;
            }
            bc_strv_free(tags);
            if (!found) {
                bc_trie_free(s);
                continue;
            }
        }
        if (filter_page != NULL) {
            if (counter < start || counter >= end) {
                counter++;
                bc_trie_free(s);
                continue;
            }
            counter++;
        }
        rv = bc_slist_append(rv, s);
    }

    bc_slist_free(sources);

    bool first = true;
    for (bc_slist_t *tmp = rv; tmp != NULL; tmp = tmp->next) {
        bc_trie_t *s = tmp->data;
        if (first) {
            const char *val = bc_trie_lookup(s, "DATE");
            if (val != NULL)
                bc_trie_insert(conf, "DATE_FIRST", bc_strdup(val));
            val = bc_trie_lookup(s, "FILENAME");
            if (val != NULL)
                bc_trie_insert(conf, "FILENAME_FIRST", bc_strdup(val));
            first = false;
        }
        if (tmp->next == NULL) {  // last
            const char *val = bc_trie_lookup(s, "DATE");
            if (val != NULL)
                bc_trie_insert(conf, "DATE_LAST", bc_strdup(val));
            val = bc_trie_lookup(s, "FILENAME");
            if (val != NULL)
                bc_trie_insert(conf, "FILENAME_LAST", bc_strdup(val));
        }
    }

    if (filter_page != NULL) {
        size_t last_page = ceilf(((float) counter) / per_page);
        bc_trie_insert(conf, "CURRENT_PAGE", bc_strdup_printf("%ld", page));
        if (page > 1)
            bc_trie_insert(conf, "PREVIOUS_PAGE", bc_strdup_printf("%ld", page - 1));
        if (page < last_page)
            bc_trie_insert(conf, "NEXT_PAGE", bc_strdup_printf("%ld", page + 1));
        if (bc_slist_length(rv) > 0)
            bc_trie_insert(conf, "FIRST_PAGE", bc_strdup("1"));
        if (last_page > 0)
            bc_trie_insert(conf, "LAST_PAGE", bc_strdup_printf("%d", last_page));
    }

    return rv;
}